

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

void __thiscall
ImageTypeManager::setConvertFunction(ImageTypeManager *this,CopyForm1 Copy,Image *in,Image *out)

{
  mapped_type *pp_Var1;
  mapped_type *pmVar2;
  imageException *this_00;
  uint8_t local_49;
  ImageTemplate<unsigned_char> local_48;
  
  local_48._vptr_ImageTemplate._0_1_ = in->_type;
  local_48._vptr_ImageTemplate._1_1_ = out->_type;
  if ((uint8_t)local_48._vptr_ImageTemplate != local_48._vptr_ImageTemplate._1_1_) {
    pp_Var1 = std::
              map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
              ::operator[](&this->_intertypeConvertMap,(key_type *)&local_48);
    *pp_Var1 = (mapped_type)Copy;
    PenguinV_Image::ImageTemplate<unsigned_char>::generate(&local_48,in,0,0,'\x01','\x01');
    local_49 = in->_type;
    pmVar2 = std::
             map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
             ::operator[](&this->_image,&local_49);
    PenguinV_Image::ImageTemplate<unsigned_char>::swap(pmVar2,&local_48);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_48);
    PenguinV_Image::ImageTemplate<unsigned_char>::generate(&local_48,out,0,0,'\x01','\x01');
    local_49 = out->_type;
    pmVar2 = std::
             map<unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
             ::operator[](&this->_image,&local_49);
    PenguinV_Image::ImageTemplate<unsigned_char>::swap(pmVar2,&local_48);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_48);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Cannot register same type images for intertype copy");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ImageTypeManager::setConvertFunction( Image_Function_Helper::FunctionTable::CopyForm1 Copy, const PenguinV_Image::Image & in, const PenguinV_Image::Image & out )
{
    if ( in.type() == out.type() )
        throw imageException( "Cannot register same type images for intertype copy" );

    _intertypeConvertMap[std::pair<uint8_t, uint8_t>( in.type(), out.type() )] = Copy;

    _image[in.type()] = in.generate();
    _image[out.type()] = out.generate();
}